

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayBuffer.cpp
# Opt level: O1

WebAssemblyArrayBuffer * __thiscall
Js::WebAssemblyArrayBuffer::GrowMemory(WebAssemblyArrayBuffer *this,uint32 newBufferLength)

{
  uint uVar1;
  JavascriptLibrary *this_00;
  InterruptPoller *pIVar2;
  Type pRVar3;
  code *pcVar4;
  bool bVar5;
  int iVar6;
  uint32 uVar7;
  byte *pbVar8;
  WebAssemblyArrayBuffer *pWVar9;
  Recycler *pRVar10;
  void *__ptr;
  undefined4 *puVar11;
  char cVar12;
  RefCountedBuffer *local;
  ulong size;
  AutoExternalAllocation local_68;
  ulong local_50;
  undefined8 local_48;
  undefined1 local_40 [8];
  AutoDisableInterrupt autoDisableInterrupt;
  
  uVar1 = (this->super_JavascriptArrayBuffer).super_ArrayBuffer.bufferLength;
  if (newBufferLength < uVar1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ArrayBuffer.cpp"
                                ,0x435,"((0))","UNREACHED");
    if (bVar5) {
      *puVar11 = 0;
      JavascriptError::ThrowTypeError
                ((((((this->super_JavascriptArrayBuffer).super_ArrayBuffer.super_ArrayBufferBase.
                     super_DynamicObject.super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
                 super_JavascriptLibraryBase).scriptContext.ptr,-0x7ff5e492,(PCWSTR)0x0);
    }
    goto LAB_00b30822;
  }
  if (newBufferLength - uVar1 == 0) {
    this_00 = (((this->super_JavascriptArrayBuffer).super_ArrayBuffer.super_ArrayBufferBase.
                super_DynamicObject.super_RecyclableObject.type.ptr)->javascriptLibrary).ptr;
    pbVar8 = (byte *)(**(code **)((long)(this->super_JavascriptArrayBuffer).super_ArrayBuffer.
                                        super_ArrayBufferBase.super_DynamicObject.
                                        super_RecyclableObject.super_FinalizableObject.
                                        super_IRecyclerVisitedObject + 0x390))(this);
    pWVar9 = JavascriptLibrary::CreateWebAssemblyArrayBuffer
                       (this_00,pbVar8,
                        (this->super_JavascriptArrayBuffer).super_ArrayBuffer.bufferLength);
  }
  else {
    iVar6 = (**(code **)((long)(this->super_JavascriptArrayBuffer).super_ArrayBuffer.
                               super_ArrayBufferBase.super_DynamicObject.super_RecyclableObject.
                               super_FinalizableObject.super_IRecyclerVisitedObject + 0x388))(this);
    if (iVar6 != 0) {
      local_40 = (undefined1  [8])
                 ((((((this->super_JavascriptArrayBuffer).super_ArrayBuffer.super_ArrayBufferBase.
                      super_DynamicObject.super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)
                  ->super_JavascriptLibraryBase).scriptContext.ptr)->threadContext;
      autoDisableInterrupt.m_threadContext._0_2_ = 0;
      autoDisableInterrupt.m_threadContext._2_1_ = 0;
      pIVar2 = ((ThreadContext *)local_40)->interruptPoller;
      if (pIVar2 != (InterruptPoller *)0x0) {
        autoDisableInterrupt.m_threadContext._0_2_ = (ushort)pIVar2->isDisabled << 8;
        pIVar2->isDisabled = true;
      }
      pRVar10 = RecyclableObject::GetRecycler((RecyclableObject *)this);
      size = (ulong)(newBufferLength - uVar1);
      bVar5 = Memory::Recycler::RequestExternalMemoryAllocation(pRVar10,size);
      if (bVar5) {
LAB_00b30546:
        local_68.allocationSucceeded = false;
        local_68.recycler = pRVar10;
        local_68.size = size;
        local_50 = size;
        __ptr = (void *)(**(code **)((long)(this->super_JavascriptArrayBuffer).super_ArrayBuffer.
                                           super_ArrayBufferBase.super_DynamicObject.
                                           super_RecyclableObject.super_FinalizableObject.
                                           super_IRecyclerVisitedObject + 0x390))(this);
        uVar1 = (this->super_JavascriptArrayBuffer).super_ArrayBuffer.bufferLength;
        pbVar8 = (byte *)realloc(__ptr,(ulong)newBufferLength);
        local_48 = CONCAT71((int7)((ulong)pbVar8 >> 8),pbVar8 != (byte *)0x0);
        if ((uVar1 < newBufferLength) && (pbVar8 != (byte *)0x0)) {
          memset(pbVar8 + uVar1,0,(ulong)newBufferLength - (ulong)uVar1);
        }
        size = local_50;
        if (pbVar8 != (byte *)0x0) {
          autoDisableInterrupt.m_threadContext._2_1_ = 1;
        }
        cVar12 = (char)local_48;
        if (pbVar8 != (byte *)0x0) {
          local_68.allocationSucceeded = true;
        }
        anon_func::AutoExternalAllocation::~AutoExternalAllocation(&local_68);
      }
      else {
        Memory::Recycler::CollectNow<(Memory::CollectionFlags)404852739>(pRVar10);
        bVar5 = Memory::Recycler::RequestExternalMemoryAllocation(pRVar10,size);
        if (bVar5) goto LAB_00b30546;
        pbVar8 = (byte *)0x0;
        cVar12 = '\0';
      }
      if (cVar12 == '\0') {
        pWVar9 = (WebAssemblyArrayBuffer *)0x0;
      }
      else {
        pRVar10 = RecyclableObject::GetRecycler((RecyclableObject *)this);
        Memory::Recycler::ReportExternalMemoryFree(pRVar10,size);
        pWVar9 = JavascriptLibrary::CreateWebAssemblyArrayBuffer
                           ((((this->super_JavascriptArrayBuffer).super_ArrayBuffer.
                              super_ArrayBufferBase.super_DynamicObject.super_RecyclableObject.type.
                             ptr)->javascriptLibrary).ptr,pbVar8,newBufferLength);
        if ((pWVar9 == (WebAssemblyArrayBuffer *)0x0) ||
           (uVar7 = (**(code **)((long)(pWVar9->super_JavascriptArrayBuffer).super_ArrayBuffer.
                                       super_ArrayBufferBase.super_DynamicObject.
                                       super_RecyclableObject.super_FinalizableObject.
                                       super_IRecyclerVisitedObject + 0x388))(pWVar9),
           uVar7 != newBufferLength)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar11 = 1;
          bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ArrayBuffer.cpp"
                                      ,0x43c,
                                      "(newArrayBuffer && newArrayBuffer->GetByteLength() == newBufferLength)"
                                      ,
                                      "newArrayBuffer && newArrayBuffer->GetByteLength() == newBufferLength"
                                     );
          if (!bVar5) goto LAB_00b30822;
          *puVar11 = 0;
        }
        pRVar3 = (this->super_JavascriptArrayBuffer).super_ArrayBuffer.bufferContent;
        ArrayBuffer::Detach((ArrayBuffer *)this);
        if (pRVar3 != (Type)0x0) {
          Memory::HeapAllocator::Free(&Memory::HeapAllocator::Instance,pRVar3,0x10);
        }
        autoDisableInterrupt.m_threadContext._0_1_ = 1;
      }
      AutoDisableInterrupt::~AutoDisableInterrupt((AutoDisableInterrupt *)local_40);
      return pWVar9;
    }
    if (uVar1 != 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ArrayBuffer.cpp"
                                  ,0x466,"(newBufferLength == growSize)",
                                  "newBufferLength == growSize");
      if (!bVar5) goto LAB_00b30822;
      *puVar11 = 0;
    }
    pWVar9 = JavascriptLibrary::CreateWebAssemblyArrayBuffer
                       ((((this->super_JavascriptArrayBuffer).super_ArrayBuffer.
                          super_ArrayBufferBase.super_DynamicObject.super_RecyclableObject.type.ptr)
                        ->javascriptLibrary).ptr,newBufferLength);
  }
  if ((pWVar9 == (WebAssemblyArrayBuffer *)0x0) ||
     (uVar7 = (**(code **)((long)(pWVar9->super_JavascriptArrayBuffer).super_ArrayBuffer.
                                 super_ArrayBufferBase.super_DynamicObject.super_RecyclableObject.
                                 super_FinalizableObject.super_IRecyclerVisitedObject + 0x388))
                        (pWVar9), uVar7 != newBufferLength)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ArrayBuffer.cpp"
                                ,0x43c,
                                "(newArrayBuffer && newArrayBuffer->GetByteLength() == newBufferLength)"
                                ,
                                "newArrayBuffer && newArrayBuffer->GetByteLength() == newBufferLength"
                               );
    if (!bVar5) {
LAB_00b30822:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar11 = 0;
  }
  pRVar3 = (this->super_JavascriptArrayBuffer).super_ArrayBuffer.bufferContent;
  ArrayBuffer::Detach((ArrayBuffer *)this);
  if (pRVar3 != (Type)0x0) {
    Memory::HeapAllocator::Free(&Memory::HeapAllocator::Instance,pRVar3,0x10);
  }
  return pWVar9;
}

Assistant:

WebAssemblyArrayBuffer* WebAssemblyArrayBuffer::GrowMemory(uint32 newBufferLength)
    {
        if (newBufferLength < this->bufferLength)
        {
            Assert(UNREACHED);
            JavascriptError::ThrowTypeError(GetScriptContext(), WASMERR_BufferGrowOnly);
        }

        uint32 growSize = newBufferLength - this->bufferLength;
        const auto finalizeGrowMemory = [&](WebAssemblyArrayBuffer* newArrayBuffer)
        {
            AssertOrFailFast(newArrayBuffer && newArrayBuffer->GetByteLength() == newBufferLength);
            RefCountedBuffer *local = this->GetBufferContent();
            // Detach the buffer from this ArrayBuffer
            this->Detach();
            if (local != nullptr)
            {
                HeapDelete(local);
            }
            return newArrayBuffer;
        };

        // We're not growing the buffer, just create a new WebAssemblyArrayBuffer and detach this
        if (growSize == 0)
        {
            return finalizeGrowMemory(this->GetLibrary()->CreateWebAssemblyArrayBuffer(this->GetBuffer(), this->bufferLength));
        }

#if ENABLE_FAST_ARRAYBUFFER
        // 8Gb Array case
        if (CONFIG_FLAG(WasmFastArray))
        {
            AssertOrFailFast(this->GetBuffer());
            const auto virtualAllocFunc = [&]
            {
                return !!VirtualAlloc(this->GetBuffer() + this->bufferLength, growSize, MEM_COMMIT, PAGE_READWRITE);
            };
            if (!this->GetRecycler()->DoExternalAllocation(growSize, virtualAllocFunc))
            {
                return nullptr;
            }

            // We are transferring the buffer to the new owner.
            // To avoid double-charge to the allocation quota we will free the "diff" amount here.
            this->GetRecycler()->ReportExternalMemoryFree(growSize);

            return finalizeGrowMemory(this->GetLibrary()->CreateWebAssemblyArrayBuffer(this->GetBuffer(), newBufferLength));
        }
#endif

        // No previous buffer case
        if (this->GetByteLength() == 0)
        {
            Assert(newBufferLength == growSize);
            // Creating a new buffer will do the external memory allocation report
            return finalizeGrowMemory(this->GetLibrary()->CreateWebAssemblyArrayBuffer(newBufferLength));
        }

        // Regular growing case
        {
            // Disable Interrupts while doing a ReAlloc to minimize chances to end up in a bad state
            AutoDisableInterrupt autoDisableInterrupt(this->GetScriptContext()->GetThreadContext(), false);

            byte* newBuffer = nullptr;
            const auto reallocFunc = [&]
            {
                newBuffer = ReallocZero(this->GetBuffer(), this->bufferLength, newBufferLength);
                if (newBuffer != nullptr)
                {
                    // Realloc freed this->buffer
                    // if anything goes wrong before we detach, we can't recover the state and should failfast
                    autoDisableInterrupt.RequireExplicitCompletion();
                }
                return !!newBuffer;
            };

            if (!this->GetRecycler()->DoExternalAllocation(growSize, reallocFunc))
            {
                return nullptr;
            }

            // We are transferring the buffer to the new owner.
            // To avoid double-charge to the allocation quota we will free the "diff" amount here.
            this->GetRecycler()->ReportExternalMemoryFree(growSize);

            WebAssemblyArrayBuffer* newArrayBuffer = finalizeGrowMemory(this->GetLibrary()->CreateWebAssemblyArrayBuffer(newBuffer, newBufferLength));
            // We've successfully Detached this buffer and created a new WebAssemblyArrayBuffer
            autoDisableInterrupt.Completed();
            return newArrayBuffer;
        }
    }